

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Nullability __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Nullability nullability)

{
  uint32_t uVar1;
  Nullability NVar2;
  
  NVar2 = NonNullable;
  if (nullability != NonNullable) {
    if ((((this->wasm->features).features & 0x400) != 0) &&
       (uVar1 = Random::upTo(&this->random,2), uVar1 == 0)) {
      return NonNullable;
    }
    NVar2 = Nullable;
  }
  return NVar2;
}

Assistant:

Nullability TranslateToFuzzReader::getSubType(Nullability nullability) {
  if (nullability == NonNullable) {
    return NonNullable;
  }
  return getNullability();
}